

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O3

bool __thiscall
libcellml::Generator::GeneratorImpl::isToBeComputedAgain
          (GeneratorImpl *this,AnalyserEquationPtr *equation)

{
  bool bVar1;
  Type TVar2;
  
  TVar2 = AnalyserEquation::type
                    ((equation->
                     super___shared_ptr<libcellml::AnalyserEquation,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
  if (TVar2 - NLA < 2) {
    bVar1 = AnalyserEquation::isStateRateBased
                      ((equation->
                       super___shared_ptr<libcellml::AnalyserEquation,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr);
    return bVar1;
  }
  return TVar2 == EXTERNAL;
}

Assistant:

bool Generator::GeneratorImpl::isToBeComputedAgain(const AnalyserEquationPtr &equation) const
{
    // NLA and algebraic equations that are state/rate-based and external
    // equations are to be computed again (in the computeVariables() method).

    switch (equation->type()) {
    case AnalyserEquation::Type::NLA:
    case AnalyserEquation::Type::ALGEBRAIC:
        return equation->isStateRateBased();
    case AnalyserEquation::Type::EXTERNAL:
        return true;
    default:
        return false;
    }
}